

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<signed_char,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase2
               (longlong lhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  char cVar1;
  bool bVar2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *pSVar3;
  char *in_RDX;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  char tmp;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  
  this = in_RDI;
  pSVar3 = (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           std::numeric_limits<long_long>::min();
  if ((in_RDI == pSVar3) &&
     (cVar1 = ::SafeInt::operator_cast_to_signed_char
                        ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0)),
     cVar1 == -1)) {
    bVar2 = div_negate_min<signed_char,_long_long,_false>::Value(&stack0xffffffffffffffe7);
    if (bVar2) {
      SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                (this,in_RDX);
      return true;
    }
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }